

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void nn_sws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint16_t uVar1;
  int iVar2;
  nn_usock *self_00;
  uint64_t uVar3;
  void *pvVar4;
  nn_sws *pnVar5;
  undefined4 uVar6;
  char *reason;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  size_t opt_sz;
  int opt;
  int rc;
  nn_sws *sws;
  nn_pipebase *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  nn_sws *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint uVar7;
  nn_usock *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  nn_ws_handshake *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  long local_38;
  int local_28;
  
  local_38 = in_RDI;
  if (in_RDI == 0) {
    local_38 = 0;
  }
  pnVar5 = (nn_sws *)(ulong)(*(int *)(local_38 + 0x58) - 1);
  switch(pnVar5) {
  case (nn_sws *)0x0:
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,899);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_38 + 0x58),0xfffffffe,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x37f);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_ws_handshake_start
              (in_stack_ffffffffffffffb0,
               (nn_usock *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (nn_pipebase *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
               (char *)in_stack_ffffffffffffff90,
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    *(undefined4 *)(local_38 + 0x58) = 2;
    break;
  case (nn_sws *)0x1:
    if (in_ESI != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x3a4);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX == 1) {
      nn_ws_handshake_stop((nn_ws_handshake *)0x172474);
      *(undefined4 *)(local_38 + 0x58) = 3;
    }
    else {
      if (in_EDX != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_38 + 0x58),2,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                ,0x3a0);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined4 *)(local_38 + 0x58) = 7;
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (nn_fsm_event *)in_stack_ffffffffffffff78,0);
    }
    break;
  case (nn_sws *)0x2:
    if (in_ESI != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x3c7);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 3) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_38 + 0x58),2,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x3c3);
      fflush(_stderr);
      nn_err_abort();
    }
    iVar2 = nn_pipebase_start(in_stack_ffffffffffffff78);
    if (iVar2 < 0) {
      *(undefined4 *)(local_38 + 0x58) = 7;
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (nn_fsm_event *)in_stack_ffffffffffffff78,0);
    }
    else {
      nn_sws_recv_hdr((nn_sws *)0x1725ed);
      *(undefined4 *)(local_38 + 0x17a0) = 1;
      *(undefined4 *)(local_38 + 0x58) = 4;
    }
    break;
  case (nn_sws *)0x3:
    if (in_ESI != 1) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x5d0);
      fflush(_stderr);
      nn_err_abort();
    }
    reason = (char *)(ulong)(in_EDX - 3);
    switch(reason) {
    case (char *)0x0:
      if (*(int *)(local_38 + 0x17a0) != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->outstate == NN_SWS_OUTSTATE_SENDING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                ,0x3d5);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined4 *)(local_38 + 0x17a0) = 1;
      nn_msg_term((nn_msg *)0x17278d);
      nn_msg_init((nn_msg *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  (size_t)in_stack_ffffffffffffff78);
      nn_pipebase_sent((nn_pipebase *)0x1727b3);
      break;
    case (char *)0x1:
      iVar2 = *(int *)(local_38 + 0x1620);
      if (iVar2 == 1) {
        if ((((*(byte *)(local_38 + 0x1624) & 0x40) == 0) &&
            ((*(byte *)(local_38 + 0x1624) & 0x20) == 0)) &&
           ((*(byte *)(local_38 + 0x1624) & 0x10) == 0)) {
          *(uint *)(local_38 + 0x1648) = *(byte *)(local_38 + 0x1624) & 0xffffff80;
          *(byte *)(local_38 + 0x1634) = *(byte *)(local_38 + 0x1625) & 0x80;
          iVar2 = *(int *)(local_38 + 0x60);
          if (iVar2 == 1) {
            if (*(char *)(local_38 + 0x1634) != '\0') {
              nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
              return;
            }
            *(undefined8 *)(local_38 + 0x1640) = 0;
          }
          else {
            if (iVar2 != 2) {
              nn_backtrace_print();
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                      ,0x40b);
              fflush(_stderr);
              nn_err_abort();
            }
            if (*(char *)(local_38 + 0x1634) == '\0') {
              nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
              return;
            }
            *(undefined8 *)(local_38 + 0x1640) = 4;
          }
          *(byte *)(local_38 + 0x1632) = *(byte *)(local_38 + 0x1624) & 0xf;
          *(byte *)(local_38 + 0x1633) = *(byte *)(local_38 + 0x1625) & 0x7f;
          if ((*(int *)(local_38 + 0x1650) == 0) && (*(char *)(local_38 + 0x1632) == '\0')) {
            nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
          }
          else {
            if (*(int *)(local_38 + 0x1650) == 0) {
              *(byte *)(local_38 + 0x169c) = *(byte *)(local_38 + 0x1624) | 0x80;
            }
            if (*(byte *)(local_38 + 0x1633) < 0x7e) {
              *(undefined8 *)(local_38 + 0x1640) = *(undefined8 *)(local_38 + 0x1640);
            }
            else if (*(char *)(local_38 + 0x1633) == '~') {
              *(long *)(local_38 + 0x1640) = *(long *)(local_38 + 0x1640) + 2;
            }
            else {
              if (*(char *)(local_38 + 0x1633) != '\x7f') {
                nn_backtrace_print();
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                        ,0x42d);
                fflush(_stderr);
                nn_err_abort();
              }
              *(long *)(local_38 + 0x1640) = *(long *)(local_38 + 0x1640) + 8;
            }
            self_00 = (nn_usock *)(ulong)*(byte *)(local_38 + 0x1632);
            switch(self_00) {
            case (nn_usock *)0x0:
              *(undefined4 *)(local_38 + 0x164c) = 0;
              *(uint *)(local_38 + 0x1650) = (uint)((*(int *)(local_38 + 0x1648) != 0 ^ 0xffU) & 1);
              if ((*(long *)(local_38 + 0x1640) == 0) && (*(char *)(local_38 + 0x1633) == '\0')) {
                if (*(int *)(local_38 + 0x60) != 1) {
                  nn_backtrace_print();
                  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->mode == NN_WS_CLIENT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                          ,0x462);
                  fflush(_stderr);
                  nn_err_abort();
                }
                *(undefined8 *)(local_38 + 0x1688) = 0;
                if (*(int *)(local_38 + 0x1650) != 0) {
                  nn_sws_recv_hdr((nn_sws *)0x172d03);
                  return;
                }
                *(undefined4 *)(local_38 + 0x1620) = 4;
                nn_pipebase_received((nn_pipebase *)0x172d28);
                return;
              }
              break;
            case (nn_usock *)0x1:
            case (nn_usock *)0x2:
              *(undefined4 *)(local_38 + 0x164c) = 0;
              if (*(int *)(local_38 + 0x1650) != 0) {
                nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
                return;
              }
              if (*(int *)(local_38 + 0x1648) == 0) {
                *(undefined4 *)(local_38 + 0x1650) = 1;
              }
              if ((*(long *)(local_38 + 0x1640) == 0) && (*(char *)(local_38 + 0x1633) == '\0')) {
                if (*(int *)(local_38 + 0x60) != 1) {
                  nn_backtrace_print();
                  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->mode == NN_WS_CLIENT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                          ,0x445);
                  fflush(_stderr);
                  nn_err_abort();
                }
                *(undefined8 *)(local_38 + 0x1688) = 0;
                if (*(int *)(local_38 + 0x1650) != 0) {
                  nn_sws_recv_hdr((nn_sws *)0x172bf0);
                  return;
                }
                *(undefined4 *)(local_38 + 0x1620) = 4;
                nn_pipebase_received((nn_pipebase *)0x172c15);
                return;
              }
              break;
            default:
              nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
              return;
            case (nn_usock *)0x8:
              *(undefined4 *)(local_38 + 0x164c) = 1;
              if (*(int *)(local_38 + 0x1648) == 0) {
                nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
                return;
              }
              if (0x7d < *(byte *)(local_38 + 0x1633)) {
                nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
                return;
              }
              if (*(char *)(local_38 + 0x1633) == '\x01') {
                nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
                return;
              }
              if ((*(long *)(local_38 + 0x1640) == 0) && (*(char *)(local_38 + 0x1633) == '\0')) {
                *(undefined8 *)(local_38 + 0x1688) = 0;
                nn_sws_acknowledge_close_handshake(in_stack_ffffffffffffff90);
                return;
              }
              break;
            case (nn_usock *)0x9:
              *(undefined4 *)(local_38 + 0x164c) = 1;
              *(int *)(local_38 + 0x1668) = *(int *)(local_38 + 0x1668) + 1;
              if (0x7d < *(byte *)(local_38 + 0x1633)) {
                nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
                return;
              }
              if (*(int *)(local_38 + 0x1648) == 0) {
                nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
                return;
              }
              if ((*(long *)(local_38 + 0x1640) == 0) && (*(char *)(local_38 + 0x1633) == '\0')) {
                *(undefined8 *)(local_38 + 0x1688) = 0;
                *(undefined4 *)(local_38 + 0x1620) = 5;
                nn_pipebase_received((nn_pipebase *)0x172dfa);
                return;
              }
              break;
            case (nn_usock *)0xa:
              *(undefined4 *)(local_38 + 0x164c) = 1;
              *(int *)(local_38 + 0x166c) = *(int *)(local_38 + 0x166c) + 1;
              if (0x7d < *(byte *)(local_38 + 0x1633)) {
                nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
                return;
              }
              if (*(int *)(local_38 + 0x1648) == 0) {
                nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
                return;
              }
              if ((*(long *)(local_38 + 0x1640) == 0) && (*(char *)(local_38 + 0x1633) == '\0')) {
                *(undefined8 *)(local_38 + 0x1688) = 0;
                *(undefined4 *)(local_38 + 0x1620) = 5;
                nn_pipebase_received((nn_pipebase *)0x172ecc);
                return;
              }
            }
            if (*(long *)(local_38 + 0x1640) == 0) {
              if (*(int *)(local_38 + 0x60) != 1) {
                nn_backtrace_print();
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->mode == NN_WS_CLIENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                        ,0x4e9);
                fflush(_stderr);
                nn_err_abort();
              }
              uVar7 = in_stack_ffffffffffffff9c & 0xffffff;
              if (*(char *)(local_38 + 0x1633) != '\0') {
                uVar7 = CONCAT13(*(byte *)(local_38 + 0x1633) < 0x7e,(int3)in_stack_ffffffffffffff9c
                                );
              }
              if ((((byte)(uVar7 >> 0x18) ^ 0xff) & 1) != 0) {
                nn_backtrace_print();
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "0 < sws->payload_ctl && sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                        ,0x4ee);
                fflush(_stderr);
                nn_err_abort();
              }
              *(ulong *)(local_38 + 0x1688) = (ulong)*(byte *)(local_38 + 0x1633);
              if (*(int *)(local_38 + 0x164c) == 0) {
                *(long *)(local_38 + 0x1690) =
                     *(long *)(local_38 + 0x1688) + *(long *)(local_38 + 0x1690);
                nn_pipebase_getopt((nn_pipebase *)pnVar5,in_stack_ffffffffffffffbc,
                                   in_stack_ffffffffffffffb8,reason,(size_t *)CONCAT44(1,iVar2));
                if ((-1 < local_28) && ((ulong)(long)local_28 < *(ulong *)(local_38 + 0x1690))) {
                  nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
                  return;
                }
                *(int *)(local_38 + 0x1698) = *(int *)(local_38 + 0x1698) + 1;
                pvVar4 = nn_msg_chunk_new((size_t)in_stack_ffffffffffffff90,
                                          (nn_list *)
                                          CONCAT44(in_stack_ffffffffffffff8c,
                                                   in_stack_ffffffffffffff88));
                *(void **)(local_38 + 0x1680) = pvVar4;
              }
              else {
                *(long *)(local_38 + 0x1680) = local_38 + 0x169d;
              }
              *(undefined4 *)(local_38 + 0x1620) = 3;
              nn_usock_recv(self_00,(void *)CONCAT44(uVar7,in_stack_ffffffffffffff98),
                            (size_t)in_stack_ffffffffffffff90,
                            (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
            }
            else {
              *(undefined4 *)(local_38 + 0x1620) = 2;
              nn_usock_recv(self_00,(void *)CONCAT44(in_stack_ffffffffffffff9c,
                                                     in_stack_ffffffffffffff98),
                            (size_t)in_stack_ffffffffffffff90,
                            (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
            }
          }
        }
        else {
          nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
        }
      }
      else if (iVar2 == 2) {
        if (*(long *)(local_38 + 0x1640) == 0) {
          nn_backtrace_print();
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->ext_hdr_len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                  ,0x51c);
          fflush(_stderr);
          nn_err_abort();
        }
        if (*(byte *)(local_38 + 0x1633) < 0x7e) {
          *(ulong *)(local_38 + 0x1688) = (ulong)*(byte *)(local_38 + 0x1633);
          if (*(char *)(local_38 + 0x1634) == '\0') {
            *(undefined8 *)(local_38 + 0x1638) = 0;
          }
          else {
            *(long *)(local_38 + 0x1638) = local_38 + 0x1626;
          }
        }
        else if (*(char *)(local_38 + 0x1633) == '~') {
          uVar1 = nn_gets((uint8_t *)(local_38 + 0x1626));
          *(ulong *)(local_38 + 0x1688) = (ulong)uVar1;
          if (*(char *)(local_38 + 0x1634) == '\0') {
            *(undefined8 *)(local_38 + 0x1638) = 0;
          }
          else {
            *(long *)(local_38 + 0x1638) = local_38 + 0x1628;
          }
        }
        else {
          if (*(char *)(local_38 + 0x1633) != '\x7f') {
            nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
            return;
          }
          uVar3 = nn_getll((uint8_t *)(local_38 + 0x1626));
          *(uint64_t *)(local_38 + 0x1688) = uVar3;
          if (*(char *)(local_38 + 0x1634) == '\0') {
            *(undefined8 *)(local_38 + 0x1638) = 0;
          }
          else {
            *(long *)(local_38 + 0x1638) = local_38 + 0x162e;
          }
        }
        if (*(long *)(local_38 + 0x1688) == 0) {
          if (*(int *)(local_38 + 0x1648) == 0) {
            nn_sws_recv_hdr((nn_sws *)0x1734a4);
          }
          else if (*(char *)(local_38 + 0x1632) == '\b') {
            nn_sws_acknowledge_close_handshake(in_stack_ffffffffffffff90);
          }
          else {
            uVar6 = 4;
            if (*(int *)(local_38 + 0x164c) != 0) {
              uVar6 = 5;
            }
            *(undefined4 *)(local_38 + 0x1620) = uVar6;
            nn_pipebase_received((nn_pipebase *)0x173498);
          }
        }
        else {
          if (*(long *)(local_38 + 0x1688) == 0) {
            nn_backtrace_print();
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->inmsg_current_chunk_len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                    ,0x55b);
            fflush(_stderr);
            nn_err_abort();
          }
          if (*(int *)(local_38 + 0x164c) == 0) {
            *(long *)(local_38 + 0x1690) =
                 *(long *)(local_38 + 0x1688) + *(long *)(local_38 + 0x1690);
            nn_pipebase_getopt((nn_pipebase *)pnVar5,in_stack_ffffffffffffffbc,
                               in_stack_ffffffffffffffb8,reason,
                               (size_t *)CONCAT44(iVar2,in_stack_ffffffffffffffa8));
            if ((-1 < local_28) && ((ulong)(long)local_28 < *(ulong *)(local_38 + 0x1690))) {
              nn_sws_fail_conn(pnVar5,in_stack_ffffffffffffffbc,reason);
              return;
            }
            *(int *)(local_38 + 0x1698) = *(int *)(local_38 + 0x1698) + 1;
            pvVar4 = nn_msg_chunk_new((size_t)in_stack_ffffffffffffff90,
                                      (nn_list *)
                                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
            ;
            *(void **)(local_38 + 0x1680) = pvVar4;
          }
          else {
            *(long *)(local_38 + 0x1680) = local_38 + 0x169d;
          }
          *(undefined4 *)(local_38 + 0x1620) = 3;
          nn_usock_recv(in_stack_ffffffffffffffa0,
                        (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        (size_t)in_stack_ffffffffffffff90,
                        (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        }
      }
      else {
        if (iVar2 != 3) {
          nn_backtrace_print();
          fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected socket instate",
                  (ulong)*(uint *)(local_38 + 0x58),1,(ulong)in_EDX,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                  ,0x5bb);
          fflush(_stderr);
          nn_err_abort();
        }
        if (*(char *)(local_38 + 0x1634) != '\0') {
          nn_sws_mask_payload(*(uint8_t **)(local_38 + 0x1680),*(size_t *)(local_38 + 0x1688),
                              *(uint8_t **)(local_38 + 0x1638),4,(int *)0x0);
        }
        pnVar5 = (nn_sws *)(ulong)*(byte *)(local_38 + 0x1632);
        switch(pnVar5) {
        case (nn_sws *)0x0:
          if ((*(byte *)(local_38 + 0x169c) & 0xf) == 1) {
            nn_sws_validate_utf8_chunk(pnVar5);
          }
          else if (*(int *)(local_38 + 0x1648) == 0) {
            nn_sws_recv_hdr((nn_sws *)0x17374c);
          }
          else {
            *(undefined4 *)(local_38 + 0x1620) = 4;
            nn_pipebase_received((nn_pipebase *)0x173740);
          }
          break;
        case (nn_sws *)0x1:
          nn_sws_validate_utf8_chunk(pnVar5);
          break;
        case (nn_sws *)0x2:
          if (*(int *)(local_38 + 0x1648) == 0) {
            nn_sws_recv_hdr((nn_sws *)0x1736ed);
          }
          else {
            *(undefined4 *)(local_38 + 0x1620) = 4;
            nn_pipebase_received((nn_pipebase *)0x1736e1);
          }
          break;
        default:
          nn_backtrace_print();
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                  ,0x5b5);
          fflush(_stderr);
          nn_err_abort();
        case (nn_sws *)0x8:
          nn_sws_acknowledge_close_handshake(pnVar5);
          break;
        case (nn_sws *)0x9:
          *(undefined4 *)(local_38 + 0x1620) = 5;
          nn_pipebase_received((nn_pipebase *)0x173773);
          break;
        case (nn_sws *)0xa:
          *(undefined4 *)(local_38 + 0x1620) = 5;
          nn_pipebase_received((nn_pipebase *)0x173798);
        }
      }
      break;
    case (char *)0x2:
      nn_pipebase_stop((nn_pipebase *)0x173885);
      *(undefined4 *)(local_38 + 0x58) = 7;
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (nn_fsm_event *)in_stack_ffffffffffffff78,0);
      break;
    default:
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_38 + 0x58),1,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x5ca);
      fflush(_stderr);
      nn_err_abort();
    case (char *)0x5:
      nn_pipebase_stop((nn_pipebase *)0x173863);
      *(undefined4 *)(local_38 + 0x58) = 6;
    }
    break;
  case (nn_sws *)0x4:
    if (in_ESI != 1) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x5f0);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX == 3) {
      if (*(int *)(local_38 + 0x17a0) != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->outstate == NN_SWS_OUTSTATE_SENDING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                ,0x5df);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined4 *)(local_38 + 0x17a0) = 1;
      *(undefined4 *)(local_38 + 0x58) = 7;
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (nn_fsm_event *)in_stack_ffffffffffffff78,0);
    }
    else if (in_EDX == 5) {
      *(undefined4 *)(local_38 + 0x58) = 7;
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (nn_fsm_event *)in_stack_ffffffffffffff78,0);
    }
    else if (in_EDX != 8) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_38 + 0x58),1,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x5ec);
      fflush(_stderr);
      nn_err_abort();
    }
    break;
  case (nn_sws *)0x5:
    if (in_ESI != 1) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x606);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 5) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_38 + 0x58),1,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x602);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined4 *)(local_38 + 0x58) = 7;
    nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (nn_fsm_event *)in_stack_ffffffffffffff78,0);
    break;
  case (nn_sws *)0x6:
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
            (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
            ,0x60f);
    fflush(_stderr);
    nn_err_abort();
  default:
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
            ,0x615);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

static void nn_sws_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_sws *sws;
    int rc;
    int opt;
    size_t opt_sz = sizeof (opt);

    sws = nn_cont (self, struct nn_sws, fsm);

    switch (sws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_SWS_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_ws_handshake_start (&sws->handshaker, sws->usock,
                    &sws->pipebase, sws->mode, sws->resource, sws->remote_host);
                sws->state = NN_SWS_STATE_HANDSHAKE;
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  HANDSHAKE state.                                                          */
/******************************************************************************/
    case NN_SWS_STATE_HANDSHAKE:
        switch (src) {

        case NN_SWS_SRC_HANDSHAKE:
            switch (type) {
            case NN_WS_HANDSHAKE_OK:

                /*  Before moving to the active state stop the handshake
                    state machine. */
                nn_ws_handshake_stop (&sws->handshaker);
                sws->state = NN_SWS_STATE_STOPPING_HANDSHAKE;
                return;

            case NN_WS_HANDSHAKE_ERROR:

                /* Raise the error and move directly to the DONE state.
                   ws_handshake object will be stopped later on. */
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done,
                    NN_SWS_RETURN_CLOSE_HANDSHAKE);
                return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_HANDSHAKE state.                                                 */
/******************************************************************************/
    case NN_SWS_STATE_STOPPING_HANDSHAKE:
        switch (src) {

        case NN_SWS_SRC_HANDSHAKE:
            switch (type) {
            case NN_WS_HANDSHAKE_STOPPED:

                 /*  Start the pipe. */
                 rc = nn_pipebase_start (&sws->pipebase);
                 if (nn_slow (rc < 0)) {
                    sws->state = NN_SWS_STATE_DONE;
                    nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                    return;
                 }

                 /*  Start receiving a message in asynchronous manner. */
                 nn_sws_recv_hdr (sws);

                 /*  Mark the pipe as available for sending. */
                 sws->outstate = NN_SWS_OUTSTATE_IDLE;

                 sws->state = NN_SWS_STATE_ACTIVE;
                 return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SWS_STATE_ACTIVE:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:

                /*  The message is now fully sent. */
                nn_assert (sws->outstate == NN_SWS_OUTSTATE_SENDING);
                sws->outstate = NN_SWS_OUTSTATE_IDLE;
                nn_msg_term (&sws->outmsg);
                nn_msg_init (&sws->outmsg, 0);
                nn_pipebase_sent (&sws->pipebase);
                return;

            case NN_USOCK_RECEIVED:

                switch (sws->instate) {
                case NN_SWS_INSTATE_RECV_HDR:

                    /*  Require RSV1, RSV2, and RSV3 bits to be unset for
                        x-nanomsg protocol as per RFC 6455 section 5.2. */
                    if (sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV1 ||
                        sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV2 ||
                        sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV3) {
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                            "RSV1, RSV2, and RSV3 must be unset.");
                        return;
                    }

                    sws->is_final_frame = sws->inhdr [0] &
                        NN_SWS_FRAME_BITMASK_FIN;
                    sws->masked = sws->inhdr [1] &
                        NN_SWS_FRAME_BITMASK_MASKED;

                    switch (sws->mode) {
                    case NN_WS_SERVER:
                        /*  Require mask bit to be set from client. */
                        if (sws->masked) {
                            /*  Continue receiving header for this frame. */
                            sws->ext_hdr_len = NN_SWS_FRAME_SIZE_MASK;
                            break;
                        }
                        else {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Server expects MASK bit to be set.");
                            return;
                        }
                    case NN_WS_CLIENT:
                        /*  Require mask bit to be unset from server. */
                        if (sws->masked) {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Client expects MASK bit to be unset.");
                            return;
                        }
                        else {
                            /*  Continue receiving header for this frame. */
                            sws->ext_hdr_len = 0;
                            break;
                        }
                    default:
                        /*  Only two modes of this endpoint are expected. */
                        nn_assert (0);
                        return;
                    }

                    sws->opcode = sws->inhdr [0] &
                        NN_SWS_FRAME_BITMASK_OPCODE;
                    sws->payload_ctl = sws->inhdr [1] &
                        NN_SWS_FRAME_BITMASK_LENGTH;

                    /*  Prevent unexpected continuation frame. */
                    if (!sws->continuing &&
                        sws->opcode == NN_WS_OPCODE_FRAGMENT) {
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                            "No message to continue.");
                        return;
                    }

                    /*  Preserve initial message opcode and RSV bits in case
                        this is a fragmented message. */
                    if (!sws->continuing)
                        sws->inmsg_hdr = sws->inhdr [0] |
                        NN_SWS_FRAME_BITMASK_FIN;

                    if (sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_0;
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_16) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_16;
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_63) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_63;
                    }
                    else {
                        /*  Developer error parsing/handling length. */
                        nn_assert (0);
                        return;
                    }

                    switch (sws->opcode) {

                    case NN_WS_OPCODE_TEXT:
                        /*  Fall thru; TEXT and BINARY handled alike. */
                    case NN_WS_OPCODE_BINARY:

                        sws->is_control_frame = 0;

                        if (sws->continuing) {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Expected continuation frame opcode.");
                            return;
                        }

                        if (!sws->is_final_frame)
                            sws->continuing = 1;

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Only a remote server could send a 2-byte msg;
                                sanity-check that this endpoint is a client. */
                            nn_assert (sws->mode == NN_WS_CLIENT);

                            sws->inmsg_current_chunk_len = 0;

                            if (sws->continuing) {
                                /*  This frame was empty, but continue
                                    next frame in fragmented sequence. */
                                nn_sws_recv_hdr (sws);
                                return;
                            }
                            else {
                                /*  Special case when there is no payload,
                                    mask, or additional frames. */
                                sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                                nn_pipebase_received (&sws->pipebase);
                                return;
                            }
                            }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_FRAGMENT:

                        sws->is_control_frame = 0;
                        sws->continuing = !sws->is_final_frame;

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Only a remote server could send a 2-byte msg;
                                sanity-check that this endpoint is a client. */
                            nn_assert (sws->mode == NN_WS_CLIENT);

                            sws->inmsg_current_chunk_len = 0;

                            if (sws->continuing) {
                                /*  This frame was empty, but continue
                                    next frame in fragmented sequence. */
                                nn_sws_recv_hdr (sws);
                                return;
                            }
                            else {
                                /*  Special case when there is no payload,
                                    mask, or additional frames. */
                                sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                                nn_pipebase_received (&sws->pipebase);
                                return;
                            }
                        }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_PING:
                        sws->is_control_frame = 1;
                        sws->pings_received++;
                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                            nn_pipebase_received (&sws->pipebase);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_PONG:
                        sws->is_control_frame = 1;
                        sws->pongs_received++;
                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                            nn_pipebase_received (&sws->pipebase);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_CLOSE:
                        /*  RFC 6455 section 5.5.1. */
                        sws->is_control_frame = 1;
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }

                        if (sws->payload_ctl == 1) {
                            /*  As per RFC 6455 section 5.5.1, if a payload is
                                to accompany a close frame, the first two bytes
                                MUST be the close code. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Expected 2byte close code.");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            nn_sws_acknowledge_close_handshake (sws);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;

                    default:
                        /*  Client sent an invalid opcode; as per RFC 6455
                            section 10.7, close connection with code. */
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Invalid opcode.");
                        return;

                    }

                    if (sws->ext_hdr_len == 0) {
                        /*  Only a remote server could send a 2-byte msg;
                            sanity-check that this endpoint is a client. */
                        nn_assert (sws->mode == NN_WS_CLIENT);

                        /*  In the case of no additional header, the payload
                            is known to be within these bounds. */
                        nn_assert (0 < sws->payload_ctl &&
                            sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH);

                        sws->inmsg_current_chunk_len = sws->payload_ctl;

                        /*  Use scatter/gather array for application messages,
                            and a fixed-width buffer for control messages. This
                            is convenient since control messages can be
                            interspersed between chunked application msgs. */
                        if (sws->is_control_frame) {
                            sws->inmsg_current_chunk_buf = sws->inmsg_control;
                        }
                        else {
                            sws->inmsg_total_size += sws->inmsg_current_chunk_len;
                            /*  Protect non-control messages against the
                                NN_RCVMAXSIZE threshold; control messages already
                                have a small pre-allocated buffer, and therefore
                                are not subject to this limit. */
                            nn_pipebase_getopt (&sws->pipebase, NN_SOL_SOCKET,
                                NN_RCVMAXSIZE, &opt, &opt_sz);
                            if (opt >= 0 && sws->inmsg_total_size > (size_t) opt) {
                                nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_TOOBIG,
                                    "Message larger than application allows.");
                                return;
                            }
                            sws->inmsg_chunks++;
                            sws->inmsg_current_chunk_buf =
                                nn_msg_chunk_new (sws->inmsg_current_chunk_len,
                                &sws->inmsg_array);
                        }

                        sws->instate = NN_SWS_INSTATE_RECV_PAYLOAD;
                        nn_usock_recv (sws->usock, sws->inmsg_current_chunk_buf,
                            sws->inmsg_current_chunk_len, NULL);
                        return;
                    }
                    else {
                        /*  Continue receiving the rest of the header frame. */
                        sws->instate = NN_SWS_INSTATE_RECV_HDREXT;
                        nn_usock_recv (sws->usock,
                            sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL,
                            sws->ext_hdr_len,
                            NULL);
                        return;
                    }

                case NN_SWS_INSTATE_RECV_HDREXT:
                    nn_assert (sws->ext_hdr_len > 0);

                    if (sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH) {
                        sws->inmsg_current_chunk_len = sws->payload_ctl;
                        if (sws->masked) {
                            sws->mask = sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_16) {
                        sws->inmsg_current_chunk_len =
                            nn_gets (sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL);
                        if (sws->masked) {
                            sws->mask = sws->inhdr +
                                NN_SWS_FRAME_SIZE_INITIAL +
                                NN_SWS_FRAME_SIZE_PAYLOAD_16;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_63) {
                        sws->inmsg_current_chunk_len =
                            (size_t) nn_getll (sws->inhdr +
                            NN_SWS_FRAME_SIZE_INITIAL);
                        if (sws->masked) {
                            sws->mask = sws->inhdr +
                                NN_SWS_FRAME_SIZE_INITIAL +
                                NN_SWS_FRAME_SIZE_PAYLOAD_63;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else {
                        /*  Client sent invalid data; as per RFC 6455,
                            server closes the connection immediately. */
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Invalid payload length.");
                        return;
                    }

                    /*  Handle zero-length message bodies. */
                    if (sws->inmsg_current_chunk_len == 0) {
                        if (sws->is_final_frame) {
                            if (sws->opcode == NN_WS_OPCODE_CLOSE) {
                                nn_sws_acknowledge_close_handshake (sws);
                            }
                            else {
                                sws->instate = (sws->is_control_frame ?
                                    NN_SWS_INSTATE_RECVD_CONTROL :
                                    NN_SWS_INSTATE_RECVD_CHUNKED);
                                nn_pipebase_received (&sws->pipebase);
                            }
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
                        return;
                    }

                    nn_assert (sws->inmsg_current_chunk_len > 0);

                    /*  Use scatter/gather array for application messages,
                        and a fixed-width buffer for control messages. This
                        is convenient since control messages can be
                        interspersed between chunked application msgs. */
                    if (sws->is_control_frame) {
                        sws->inmsg_current_chunk_buf = sws->inmsg_control;
                    }
                    else {
                        sws->inmsg_total_size += sws->inmsg_current_chunk_len;
                        /*  Protect non-control messages against the
                            NN_RCVMAXSIZE threshold; control messages already
                            have a small pre-allocated buffer, and therefore
                            are not subject to this limit. */
                        nn_pipebase_getopt (&sws->pipebase, NN_SOL_SOCKET,
                            NN_RCVMAXSIZE, &opt, &opt_sz);
                        if (opt >= 0 && sws->inmsg_total_size > (size_t) opt) {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_TOOBIG,
                                "Message size exceeds limit.");
                            return;
                        }
                        sws->inmsg_chunks++;
                        sws->inmsg_current_chunk_buf =
                            nn_msg_chunk_new (sws->inmsg_current_chunk_len,
                            &sws->inmsg_array);
                    }

                    sws->instate = NN_SWS_INSTATE_RECV_PAYLOAD;
                    nn_usock_recv (sws->usock, sws->inmsg_current_chunk_buf,
                        sws->inmsg_current_chunk_len, NULL);
                    return;

                case NN_SWS_INSTATE_RECV_PAYLOAD:

                    /*  Unmask if necessary. */
                    if (sws->masked) {
                        nn_sws_mask_payload (sws->inmsg_current_chunk_buf,
                            sws->inmsg_current_chunk_len, sws->mask,
                            NN_SWS_FRAME_SIZE_MASK, NULL);
                    }

                    switch (sws->opcode) {

                    case NN_WS_OPCODE_TEXT:
                        nn_sws_validate_utf8_chunk (sws);
                        return;

                    case NN_WS_OPCODE_BINARY:
                        if (sws->is_final_frame) {
                            sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                            nn_pipebase_received (&sws->pipebase);
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
                        return;

                    case NN_WS_OPCODE_FRAGMENT:
                        /*  Must check original opcode to see if this fragment
                            needs UTF-8 validation. */
                        if ((sws->inmsg_hdr & NN_SWS_FRAME_BITMASK_OPCODE) ==
                            NN_WS_OPCODE_TEXT) {
                            nn_sws_validate_utf8_chunk (sws);
                        }
                        else if (sws->is_final_frame) {
                            sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                            nn_pipebase_received (&sws->pipebase);
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
                        return;

                    case NN_WS_OPCODE_PING:
                        sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                        nn_pipebase_received (&sws->pipebase);
                        return;

                    case NN_WS_OPCODE_PONG:
                        sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                        nn_pipebase_received (&sws->pipebase);
                        return;

                    case NN_WS_OPCODE_CLOSE:
                        nn_sws_acknowledge_close_handshake (sws);
                        return;

                    default:
                        /*  This should have been prevented upstream. */
                        nn_assert (0);
                        return;
                    }

                default:
                    nn_fsm_error ("Unexpected socket instate",
                        sws->state, src, type);
                }

            case NN_USOCK_SHUTDOWN:
                nn_pipebase_stop (&sws->pipebase);
                sws->state = NN_SWS_STATE_BROKEN_CONNECTION;
                return;

            case NN_USOCK_ERROR:
                nn_pipebase_stop (&sws->pipebase);
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

            break;

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  CLOSING_CONNECTION state.                                                 */
/*  Wait for acknowledgement closing handshake was successfully sent.         */
/******************************************************************************/
    case NN_SWS_STATE_CLOSING_CONNECTION:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  Wait for acknowledgement closing handshake was sent
                    to peer. */
                nn_assert (sws->outstate == NN_SWS_OUTSTATE_SENDING);
                sws->outstate = NN_SWS_OUTSTATE_IDLE;
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done,
                    NN_SWS_RETURN_CLOSE_HANDSHAKE);
                return;
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_ERROR:
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  SHUTTING_DOWN state.                                                      */
/*  The underlying connection is closed. We are just waiting that underlying  */
/*  usock being closed                                                        */
/******************************************************************************/
    case NN_SWS_STATE_BROKEN_CONNECTION:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ERROR:
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The underlying connection is closed. There's nothing that can be done in  */
/*  this state except stopping the object.                                    */
/******************************************************************************/
    case NN_SWS_STATE_DONE:
        nn_fsm_bad_source (sws->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sws->state, src, type);
    }
}